

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportFunc
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index func_index,Index sig_index)

{
  char *pcVar1;
  Offset OVar2;
  FuncType *pFVar3;
  Module *this_00;
  size_t sVar4;
  undefined1 auStack_c8 [8];
  Location loc;
  undefined1 local_a0 [8];
  string_view module_name_local;
  undefined1 local_80 [56];
  undefined1 local_48 [8];
  string_view field_name_local;
  long local_30;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  
  field_name_local.data_ = (char *)field_name.size_;
  local_48 = (undefined1  [8])field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  local_a0 = (undefined1  [8])module_name.data_;
  MakeUnique<wabt::FuncImport>();
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_a0);
  std::__cxx11::string::operator=((string *)(local_30 + 8),(string *)&module_name_local.size_);
  if ((undefined1 *)module_name_local.size_ != local_80) {
    operator_delete((void *)module_name_local.size_);
  }
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_48);
  std::__cxx11::string::operator=((string *)(local_30 + 0x28),(string *)&module_name_local.size_);
  if ((undefined1 *)module_name_local.size_ != local_80) {
    operator_delete((void *)module_name_local.size_);
  }
  *(undefined1 *)(local_30 + 0x70) = 1;
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  auStack_c8 = (undefined1  [8])0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  pcVar1 = this->filename_;
  sVar4 = strlen(pcVar1);
  loc.filename.data_._0_4_ = (undefined4)sVar4;
  loc.filename.data_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar2;
  loc.filename.size_._4_4_ = (undefined4)(OVar2 >> 0x20);
  auStack_c8 = (undefined1  [8])pcVar1;
  Var::Var((Var *)&module_name_local.size_,sig_index,(Location *)auStack_c8);
  Var::operator=((Var *)(local_30 + 0x78),(Var *)&module_name_local.size_);
  Var::~Var((Var *)&module_name_local.size_);
  pFVar3 = (this->module_->func_types).
           super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
           super__Vector_impl_data._M_start[sig_index];
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_30 + 0xc0),
             &(pFVar3->sig).param_types);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_30 + 0xd8),
             &(pFVar3->sig).result_types);
  this_00 = this->module_;
  pcVar1 = this->filename_;
  sVar4 = strlen(pcVar1);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  field_name_local.size_ = (size_type)operator_new(0x48);
  *(undefined8 *)(field_name_local.size_ + 8) = 0;
  *(undefined8 *)(field_name_local.size_ + 0x10) = 0;
  *(char **)(field_name_local.size_ + 0x18) = pcVar1;
  *(size_t *)(field_name_local.size_ + 0x20) = sVar4;
  *(Offset *)(field_name_local.size_ + 0x28) = OVar2;
  *(undefined8 *)(field_name_local.size_ + 0x30) = 0;
  *(undefined4 *)(field_name_local.size_ + 0x38) = 2;
  *(undefined ***)field_name_local.size_ = &PTR__ImportModuleField_0155b118;
  *(long *)(field_name_local.size_ + 0x40) = local_30;
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&field_name_local.size_);
  if (field_name_local.size_ != 0) {
    (**(code **)(*(long *)field_name_local.size_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportFunc(Index import_index,
                                    string_view module_name,
                                    string_view field_name,
                                    Index func_index,
                                    Index sig_index) {
  auto import = MakeUnique<FuncImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->func.decl.has_func_type = true;
  import->func.decl.type_var = Var(sig_index, GetLocation());
  import->func.decl.sig = module_->func_types[sig_index]->sig;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}